

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O1

Point3f __thiscall
pbrt::TransformMapping3D::Map
          (TransformMapping3D *this,TextureEvalContext ctx,Vector3f *dpdx,Vector3f *dpdy)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Point3f PVar9;
  
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->textureFromRender).m.m[0][1])),
                           ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][2]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->textureFromRender).m.m[1][1])),
                           ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][2]));
  auVar7 = vinsertps_avx(auVar7,auVar8,0x10);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->textureFromRender).m.m[2][1])),
                           ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][2]));
  uVar1 = vmovlps_avx(auVar7);
  (dpdx->super_Tuple3<pbrt::Vector3,_float>).x = (float)(int)uVar1;
  (dpdx->super_Tuple3<pbrt::Vector3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
  (dpdx->super_Tuple3<pbrt::Vector3,_float>).z = auVar8._0_4_;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->textureFromRender).m.m[0][1])),
                           ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][2]));
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->textureFromRender).m.m[1][1])),
                           ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][2]));
  auVar7 = vinsertps_avx(auVar7,auVar8,0x10);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y *
                                         (this->textureFromRender).m.m[2][1])),
                           ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][0]));
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][2]));
  uVar1 = vmovlps_avx(auVar7);
  (dpdy->super_Tuple3<pbrt::Vector3,_float>).x = (float)(int)uVar1;
  (dpdy->super_Tuple3<pbrt::Vector3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
  (dpdy->super_Tuple3<pbrt::Vector3,_float>).z = auVar8._0_4_;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(ctx.p.super_Tuple3<pbrt::Point3,_float>.y *
                                         (this->textureFromRender).m.m[0][1])),
                           ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[0][2]));
  fVar3 = auVar7._0_4_ + (this->textureFromRender).m.m[0][3];
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(ctx.p.super_Tuple3<pbrt::Point3,_float>.y *
                                         (this->textureFromRender).m.m[1][1])),
                           ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[1][2]));
  fVar4 = auVar7._0_4_ + (this->textureFromRender).m.m[1][3];
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(ctx.p.super_Tuple3<pbrt::Point3,_float>.y *
                                         (this->textureFromRender).m.m[2][1])),
                           ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[2][2]));
  fVar5 = auVar7._0_4_ + (this->textureFromRender).m.m[2][3];
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(ctx.p.super_Tuple3<pbrt::Point3,_float>.y *
                                         (this->textureFromRender).m.m[3][1])),
                           ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.x),
                           ZEXT416((uint)(this->textureFromRender).m.m[3][0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)ctx.p.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(this->textureFromRender).m.m[3][2]));
  fVar6 = auVar7._0_4_ + (this->textureFromRender).m.m[3][3];
  bVar2 = fVar6 == 1.0;
  auVar7 = vinsertps_avx(ZEXT416((uint)bVar2 * (int)fVar3 + (uint)!bVar2 * (int)(fVar3 / fVar6)),
                         ZEXT416((uint)bVar2 * (int)fVar4 + (uint)!bVar2 * (int)(fVar4 / fVar6)),
                         0x10);
  PVar9.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar7._0_8_;
  PVar9.super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar2 * (int)fVar5 + (uint)!bVar2 * (int)(fVar5 / fVar6));
  return (Point3f)PVar9.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

inline Vector3<T> Transform::operator()(const Vector3<T> &v) const {
    T x = v.x, y = v.y, z = v.z;
    return Vector3<T>(m[0][0] * x + m[0][1] * y + m[0][2] * z,
                      m[1][0] * x + m[1][1] * y + m[1][2] * z,
                      m[2][0] * x + m[2][1] * y + m[2][2] * z);
}